

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::ProducerIPCClientImpl::~ProducerIPCClientImpl(ProducerIPCClientImpl *this)

{
  ProducerIPCClientImpl *this_local;
  
  (this->super_ProducerEndpoint)._vptr_ProducerEndpoint =
       (_func_int **)&PTR__ProducerIPCClientImpl_009c3b68;
  (this->super_EventListener)._vptr_EventListener =
       (_func_int **)&PTR__ProducerIPCClientImpl_009c3c18;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->pending_sync_reqs_);
  ::std::__cxx11::string::~string((string *)&this->name_);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            (&this->data_sources_setup_);
  std::
  unique_ptr<perfetto::SharedMemoryArbiter,_std::default_delete<perfetto::SharedMemoryArbiter>_>::
  ~unique_ptr(&this->shared_memory_arbiter_);
  std::unique_ptr<perfetto::SharedMemory,_std::default_delete<perfetto::SharedMemory>_>::~unique_ptr
            (&this->shared_memory_);
  protos::gen::ProducerPortProxy::~ProducerPortProxy(&this->producer_port_);
  std::unique_ptr<perfetto::ipc::Client,_std::default_delete<perfetto::ipc::Client>_>::~unique_ptr
            (&this->ipc_channel_);
  ipc::ServiceProxy::EventListener::~EventListener(&this->super_EventListener);
  ProducerEndpoint::~ProducerEndpoint(&this->super_ProducerEndpoint);
  return;
}

Assistant:

ProducerIPCClientImpl::~ProducerIPCClientImpl() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
}